

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.c
# Opt level: O1

int lys_print_clb(_func_ssize_t_void_ptr_void_ptr_size_t *writeclb,void *arg,lys_module *module,
                 LYS_OUTFORMAT format,char *target_node)

{
  int iVar1;
  LY_ERR *pLVar2;
  undefined1 local_28 [8];
  lyout out;
  
  if (writeclb == (_func_ssize_t_void_ptr_void_ptr_size_t *)0x0 || module == (lys_module *)0x0) {
    pLVar2 = ly_errno_location();
    *pLVar2 = LY_EINVAL;
    iVar1 = 1;
  }
  else {
    local_28._0_4_ = LYOUT_CALLBACK;
    out._0_8_ = writeclb;
    out.method.f = (FILE *)arg;
    iVar1 = lys_print_((lyout *)local_28,module,format,target_node);
  }
  return iVar1;
}

Assistant:

API int
lys_print_clb(ssize_t (*writeclb)(void *arg, const void *buf, size_t count), void *arg, const struct lys_module *module, LYS_OUTFORMAT format, const char *target_node)
{
    struct lyout out;

    if (!writeclb || !module) {
        ly_errno = LY_EINVAL;
        return EXIT_FAILURE;
    }

    out.type = LYOUT_CALLBACK;
    out.method.clb.f = writeclb;
    out.method.clb.arg = arg;

    return lys_print_(&out, module, format, target_node);
}